

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::readNames(WasmBinaryBuilder *this,size_t payloadLen)

{
  Module *pMVar1;
  Name name_;
  Name name__00;
  Name name__01;
  Name name__02;
  Name name__03;
  Name name__04;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  void *pvVar6;
  size_type sVar7;
  reference pvVar8;
  pointer pFVar9;
  size_t sVar10;
  ulong uVar11;
  mapped_type *pmVar12;
  reference pvVar13;
  mapped_type *pmVar14;
  reference this_00;
  pointer this_01;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *this_02;
  pointer pEVar15;
  reference this_03;
  reference this_04;
  pointer this_05;
  reference this_06;
  pointer this_07;
  reference this_08;
  pointer this_09;
  reference this_10;
  pointer this_11;
  string_view sVar16;
  Name NVar17;
  string_view name_00;
  bool local_d49;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  string local_9b0;
  string local_990;
  string local_970;
  allocator<char> local_949;
  string local_948 [32];
  size_t local_928;
  size_t sStack_920;
  string_view local_918;
  size_t sStack_908;
  Name name_8;
  Name rawName_8;
  ulong uStack_8e0;
  uint32_t index_7;
  size_t i_10;
  NameProcessor processor_9;
  uint32_t num_7;
  undefined1 local_888 [8];
  Name name_7;
  Name rawName_7;
  ulong uStack_860;
  uint32_t fieldIndex;
  size_t i_9;
  NameProcessor processor_8;
  uint32_t numFields;
  bool validType;
  ulong uStack_810;
  uint32_t typeIndex;
  size_t i_8;
  undefined1 local_800 [4];
  uint32_t numTypes;
  allocator<char> local_7d9;
  string local_7d8 [32];
  size_t local_7b8;
  size_t sStack_7b0;
  string_view local_7a8;
  size_t sStack_790;
  Name name_6;
  Name rawName_6;
  ulong uStack_768;
  uint32_t index_6;
  size_t i_7;
  NameProcessor processor_7;
  undefined1 local_720 [4];
  uint32_t num_6;
  allocator<char> local_6f9;
  string local_6f8 [32];
  size_t local_6d8;
  size_t sStack_6d0;
  string_view local_6c8;
  size_t sStack_6b0;
  Name name_5;
  Name rawName_5;
  ulong uStack_688;
  uint32_t index_5;
  size_t i_6;
  NameProcessor processor_6;
  undefined1 local_640 [4];
  uint32_t num_5;
  allocator<char> local_619;
  string local_618 [32];
  size_t local_5f8;
  size_t sStack_5f0;
  string_view local_5e8;
  size_t sStack_5d0;
  Name name_4;
  Name rawName_4;
  ulong uStack_5a8;
  uint32_t index_4;
  size_t i_5;
  NameProcessor processor_5;
  undefined1 local_560 [4];
  uint32_t num_4;
  allocator<char> local_539;
  string local_538 [32];
  size_t local_518;
  size_t sStack_510;
  string_view local_508;
  size_t sStack_4f0;
  Name name_3;
  Name rawName_3;
  ulong uStack_4c8;
  uint32_t index_3;
  size_t i_4;
  NameProcessor processor_4;
  undefined1 local_480 [4];
  uint32_t num_3;
  allocator<char> local_459;
  string local_458 [32];
  size_t local_438;
  size_t sStack_430;
  reference local_420;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  iterator __end9;
  iterator __begin9;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range9;
  Table *table;
  undefined1 auStack_3e0 [8];
  Name name_2;
  Name rawName_2;
  ulong uStack_3b8;
  uint32_t index_2;
  size_t i_3;
  NameProcessor processor_3;
  undefined1 local_370 [4];
  uint32_t num_2;
  allocator<char> local_349;
  string local_348 [32];
  string_view local_328;
  undefined1 local_318 [8];
  Name name_1;
  Name rawName_1;
  ulong uStack_2f0;
  uint32_t index_1;
  size_t i_2;
  NameProcessor processor_2;
  uint32_t num_1;
  string local_288;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  string local_218;
  string_view local_1f8;
  undefined1 local_1e0 [8];
  Name localName;
  Name rawLocalName;
  ulong uStack_1b8;
  uint32_t localIndex;
  size_t j;
  NameProcessor processor_1;
  undefined1 local_170 [4];
  uint32_t numLocals;
  pointer local_150;
  Function *func;
  ulong uStack_140;
  uint32_t funcIndex;
  size_t i_1;
  undefined1 local_130 [4];
  uint32_t numFuncs;
  allocator<char> local_109;
  string local_108 [32];
  size_t local_e8;
  size_t sStack_e0;
  string_view local_d8;
  size_t sStack_c8;
  Name name;
  Name rawName;
  ulong uStack_90;
  uint32_t index;
  size_t i;
  NameProcessor processor;
  undefined1 auStack_48 [4];
  uint32_t num;
  size_t local_38;
  size_t subsectionPos;
  uint local_28;
  uint32_t subsectionSize;
  uint32_t nameType;
  uint32_t lastType;
  size_t sectionPos;
  size_t payloadLen_local;
  WasmBinaryBuilder *this_local;
  
  sectionPos = payloadLen;
  payloadLen_local = (size_t)this;
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::operator<<((ostream *)&std::cerr,"== readNames\n");
  }
  _nameType = this->pos;
  subsectionSize = 0;
  do {
    if (_nameType + sectionPos <= this->pos) {
      if (this->pos == _nameType + sectionPos) {
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9d8,"bad names section position change",&local_9d9);
      throwError(this,&local_9d8);
    }
    local_28 = getU32LEB(this);
    if ((subsectionSize != 0) && (local_28 <= subsectionSize)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"warning: out-of-order name subsection: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_28);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    subsectionSize = local_28;
    subsectionPos._4_4_ = getU32LEB(this);
    local_38 = this->pos;
    if (local_28 == 0) {
      _auStack_48 = (string_view)getInlineString(this);
      wasm::Name::operator=(&this->wasm->name,(Name *)auStack_48);
    }
    else if (local_28 == 1) {
      processor.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i);
      for (uStack_90 = 0; uStack_90 < processor.usedNames._M_h._M_single_bucket._4_4_;
          uStack_90 = uStack_90 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name.super_IString.str._M_str = (char *)sVar16._M_len;
        local_d8 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i,(Name)sVar16);
        name.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        sStack_c8 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::size(&this->wasm->functions);
        if (uVar3 < sVar7) {
          pvVar8 = std::
                   vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ::operator[](&this->wasm->functions,(ulong)uVar3);
          pFVar9 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                             (pvVar8);
          local_e8 = sStack_c8;
          sStack_e0 = name.super_IString.str._M_len;
          name__04.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
          name__04.super_IString.str._M_len = sStack_c8;
          Named::setExplicitName((Named *)pFVar9,name__04);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: function index out of bounds in name section, function subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_108,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name.super_IString.str._M_str,&local_109);
          poVar5 = std::operator<<(poVar5,local_108);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_130,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_130);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_130);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator(&local_109);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i);
    }
    else if (local_28 == 2) {
      i_1._4_4_ = getU32LEB(this);
      for (uStack_140 = 0; uStack_140 < i_1._4_4_; uStack_140 = uStack_140 + 1) {
        func._4_4_ = getU32LEB(this);
        local_150 = (pointer)0x0;
        uVar11 = (ulong)func._4_4_;
        sVar7 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::size(&this->wasm->functions);
        if (uVar11 < sVar7) {
          pvVar8 = std::
                   vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ::operator[](&this->wasm->functions,(ulong)func._4_4_);
          local_150 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                (pvVar8);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: function index out of bounds in name section, local subsection: "
                                  );
          std::__cxx11::to_string((string *)local_170,func._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)local_170);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_170);
        }
        processor_1.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
        NameProcessor::NameProcessor((NameProcessor *)&j);
        name_00._M_str = (char *)rawLocalName.super_IString.str._M_len;
        name_00._M_len = (size_t)localName.super_IString.str._M_str;
        uStack_1b8 = 0;
        while( true ) {
          rawLocalName.super_IString.str._M_len = (size_t)name_00._M_str;
          localName.super_IString.str._M_str = (char *)name_00._M_len;
          if (processor_1.usedNames._M_h._M_single_bucket._4_4_ <= uStack_1b8) break;
          rawLocalName.super_IString.str._M_str._4_4_ = getU32LEB(this);
          name_00 = (string_view)getInlineString(this);
          rawLocalName.super_IString.str._M_len = (size_t)name_00._M_str;
          localName.super_IString.str._M_str = (char *)name_00._M_len;
          if (local_150 != (pointer)0x0) {
            local_1f8 = name_00;
            NVar17 = NameProcessor::process((NameProcessor *)&j,(Name)name_00);
            localName.super_IString.str._M_len = NVar17.super_IString.str._M_str;
            local_1e0 = NVar17.super_IString.str._M_len;
            sVar10 = IString::size((IString *)local_1e0);
            if (sVar10 == 0) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"warning: empty local name at index ");
              std::__cxx11::to_string(&local_218,rawLocalName.super_IString.str._M_str._4_4_);
              poVar5 = std::operator<<(poVar5,(string *)&local_218);
              poVar5 = std::operator<<(poVar5," in function ");
              pFVar9 = local_150;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        (local_238,(basic_string_view<char,_std::char_traits<char>_> *)pFVar9,
                         &local_239);
              poVar5 = std::operator<<(poVar5,local_238);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_238);
              std::allocator<char>::~allocator(&local_239);
              std::__cxx11::string::~string((string *)&local_218);
            }
            else {
              uVar11 = (ulong)rawLocalName.super_IString.str._M_str._4_4_;
              sVar10 = Function::getNumLocals(local_150);
              if (uVar11 < sVar10) {
                pmVar12 = std::
                          unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                          ::operator[](&local_150->localNames,
                                       (key_type *)
                                       ((long)&rawLocalName.super_IString.str._M_str + 4));
                wasm::Name::operator=(pmVar12,(Name *)local_1e0);
              }
              else {
                poVar5 = std::operator<<((ostream *)&std::cerr,
                                         "warning: local index out of bounds in name section, local subsection: "
                                        );
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          (local_260,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           &localName.super_IString.str._M_str,&local_261);
                poVar5 = std::operator<<(poVar5,local_260);
                poVar5 = std::operator<<(poVar5," at index ");
                std::__cxx11::to_string(&local_288,rawLocalName.super_IString.str._M_str._4_4_);
                poVar5 = std::operator<<(poVar5,(string *)&local_288);
                poVar5 = std::operator<<(poVar5," in function ");
                pFVar9 = local_150;
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&num_1,
                           (basic_string_view<char,_std::char_traits<char>_> *)pFVar9,
                           (allocator<char> *)
                           ((long)&processor_2.usedNames._M_h._M_single_bucket + 7));
                poVar5 = std::operator<<(poVar5,(string *)&num_1);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::~string((string *)&num_1);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&processor_2.usedNames._M_h._M_single_bucket + 7));
                std::__cxx11::string::~string((string *)&local_288);
                std::__cxx11::string::~string(local_260);
                std::allocator<char>::~allocator(&local_261);
              }
            }
            name_00._M_str = (char *)rawLocalName.super_IString.str._M_len;
            name_00._M_len = (size_t)localName.super_IString.str._M_str;
          }
          uStack_1b8 = uStack_1b8 + 1;
        }
        NameProcessor::~NameProcessor((NameProcessor *)&j);
      }
    }
    else if (local_28 == 4) {
      processor_2.usedNames._M_h._M_single_bucket._0_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_2);
      for (uStack_2f0 = 0; uStack_2f0 < (uint32_t)processor_2.usedNames._M_h._M_single_bucket;
          uStack_2f0 = uStack_2f0 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name_1.super_IString.str._M_str = (char *)sVar16._M_len;
        local_328 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i_2,(Name)sVar16);
        name_1.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        local_318 = NVar17.super_IString.str._M_len;
        sVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
        if (uVar3 < sVar7) {
          pMVar1 = this->wasm;
          pvVar13 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                              (&this->types,(ulong)uVar3);
          pmVar14 = std::
                    unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                    ::operator[](&pMVar1->typeNames,pvVar13);
          wasm::Name::operator=(&pmVar14->name,(Name *)local_318);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: type index out of bounds in name section, type subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_348,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_1.super_IString.str._M_str,&local_349);
          poVar5 = std::operator<<(poVar5,local_348);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_370,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_370);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_370);
          std::__cxx11::string::~string(local_348);
          std::allocator<char>::~allocator(&local_349);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_2);
    }
    else if (local_28 == 5) {
      processor_3.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_3);
      for (uStack_3b8 = 0; uStack_3b8 < processor_3.usedNames._M_h._M_single_bucket._4_4_;
          uStack_3b8 = uStack_3b8 + 1) {
        uVar3 = getU32LEB(this);
        NVar17 = getInlineString(this);
        name_2.super_IString.str._M_str = NVar17.super_IString.str._M_len;
        NVar17 = NameProcessor::process((NameProcessor *)&i_3,NVar17);
        name_2.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        auStack_3e0 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ::size(&this->wasm->tables);
        if (uVar3 < sVar7) {
          this_00 = std::
                    vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                    ::operator[](&this->wasm->tables,(ulong)uVar3);
          this_01 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::get(this_00);
          this_02 = &this->wasm->elementSegments;
          __end9 = std::
                   vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ::begin(this_02);
          segment = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    std::
                    vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                    ::end(this_02);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end9,(__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                                        *)&segment);
            if (!bVar2) break;
            local_420 = __gnu_cxx::
                        __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                        ::operator*(&__end9);
            pEVar15 = std::
                      unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                      operator->(local_420);
            bVar2 = IString::operator==(&(pEVar15->table).super_IString,(IString *)this_01);
            if (bVar2) {
              pEVar15 = std::
                        unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                        ::operator->(local_420);
              wasm::Name::operator=(&pEVar15->table,(Name *)auStack_3e0);
            }
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
            ::operator++(&__end9);
          }
          local_438 = (size_t)auStack_3e0;
          sStack_430 = name_2.super_IString.str._M_len;
          name__03.super_IString.str._M_str = (char *)name_2.super_IString.str._M_len;
          name__03.super_IString.str._M_len = (size_t)auStack_3e0;
          Named::setExplicitName((Named *)this_01,name__03);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: table index out of bounds in name section, table subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_458,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_2.super_IString.str._M_str,&local_459);
          poVar5 = std::operator<<(poVar5,local_458);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_480,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_480);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_480);
          std::__cxx11::string::~string(local_458);
          std::allocator<char>::~allocator(&local_459);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_3);
    }
    else if (local_28 == 8) {
      processor_4.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_4);
      for (uStack_4c8 = 0; uStack_4c8 < processor_4.usedNames._M_h._M_single_bucket._4_4_;
          uStack_4c8 = uStack_4c8 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name_3.super_IString.str._M_str = (char *)sVar16._M_len;
        local_508 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i_4,(Name)sVar16);
        name_3.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        sStack_4f0 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ::size(&this->wasm->elementSegments);
        if (uVar3 < sVar7) {
          this_03 = std::
                    vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                    ::operator[](&this->wasm->elementSegments,(ulong)uVar3);
          pEVar15 = std::
                    unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                    operator->(this_03);
          local_518 = sStack_4f0;
          sStack_510 = name_3.super_IString.str._M_len;
          name__02.super_IString.str._M_str = (char *)name_3.super_IString.str._M_len;
          name__02.super_IString.str._M_len = sStack_4f0;
          Named::setExplicitName(&pEVar15->super_Named,name__02);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: elem index out of bounds in name section, elem subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_538,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_3.super_IString.str._M_str,&local_539);
          poVar5 = std::operator<<(poVar5,local_538);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_560,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_560);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_560);
          std::__cxx11::string::~string(local_538);
          std::allocator<char>::~allocator(&local_539);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_4);
    }
    else if (local_28 == 6) {
      processor_5.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_5);
      for (uStack_5a8 = 0; uStack_5a8 < processor_5.usedNames._M_h._M_single_bucket._4_4_;
          uStack_5a8 = uStack_5a8 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name_4.super_IString.str._M_str = (char *)sVar16._M_len;
        local_5e8 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i_5,(Name)sVar16);
        name_4.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        sStack_5d0 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::size(&this->wasm->memories);
        if (uVar3 < sVar7) {
          this_04 = std::
                    vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ::operator[](&this->wasm->memories,(ulong)uVar3);
          this_05 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                              (this_04);
          local_5f8 = sStack_5d0;
          sStack_5f0 = name_4.super_IString.str._M_len;
          name__01.super_IString.str._M_str = (char *)name_4.super_IString.str._M_len;
          name__01.super_IString.str._M_len = sStack_5d0;
          Named::setExplicitName((Named *)this_05,name__01);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: memory index out of bounds in name section, memory subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_618,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_4.super_IString.str._M_str,&local_619);
          poVar5 = std::operator<<(poVar5,local_618);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_640,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_640);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_640);
          std::__cxx11::string::~string(local_618);
          std::allocator<char>::~allocator(&local_619);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_5);
    }
    else if (local_28 == 9) {
      processor_6.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_6);
      for (uStack_688 = 0; uStack_688 < processor_6.usedNames._M_h._M_single_bucket._4_4_;
          uStack_688 = uStack_688 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name_5.super_IString.str._M_str = (char *)sVar16._M_len;
        local_6c8 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i_6,(Name)sVar16);
        name_5.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        sStack_6b0 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ::size(&this->wasm->dataSegments);
        if (uVar3 < sVar7) {
          this_06 = std::
                    vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ::operator[](&this->wasm->dataSegments,uStack_688);
          this_07 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                    operator->(this_06);
          local_6d8 = sStack_6b0;
          sStack_6d0 = name_5.super_IString.str._M_len;
          name__00.super_IString.str._M_str = (char *)name_5.super_IString.str._M_len;
          name__00.super_IString.str._M_len = sStack_6b0;
          Named::setExplicitName(&this_07->super_Named,name__00);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: data index out of bounds in name section, data subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_6f8,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_5.super_IString.str._M_str,&local_6f9);
          poVar5 = std::operator<<(poVar5,local_6f8);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_720,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_720);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_720);
          std::__cxx11::string::~string(local_6f8);
          std::allocator<char>::~allocator(&local_6f9);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_6);
    }
    else if (local_28 == 7) {
      processor_7.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_7);
      for (uStack_768 = 0; uStack_768 < processor_7.usedNames._M_h._M_single_bucket._4_4_;
          uStack_768 = uStack_768 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name_6.super_IString.str._M_str = (char *)sVar16._M_len;
        local_7a8 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i_7,(Name)sVar16);
        name_6.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        sStack_790 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ::size(&this->wasm->globals);
        if (uVar3 < sVar7) {
          this_08 = std::
                    vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ::operator[](&this->wasm->globals,(ulong)uVar3);
          this_09 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                              (this_08);
          local_7b8 = sStack_790;
          sStack_7b0 = name_6.super_IString.str._M_len;
          name_.super_IString.str._M_str = (char *)name_6.super_IString.str._M_len;
          name_.super_IString.str._M_len = sStack_790;
          Named::setExplicitName((Named *)this_09,name_);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: global index out of bounds in name section, global subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_7d8,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_6.super_IString.str._M_str,&local_7d9);
          poVar5 = std::operator<<(poVar5,local_7d8);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string((string *)local_800,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)local_800);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_800);
          std::__cxx11::string::~string(local_7d8);
          std::allocator<char>::~allocator(&local_7d9);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_7);
    }
    else if (local_28 == 10) {
      uVar3 = getU32LEB(this);
      for (uStack_810 = 0; uStack_810 < uVar3; uStack_810 = uStack_810 + 1) {
        uVar4 = getU32LEB(this);
        sVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
        local_d49 = false;
        if (uVar4 < sVar7) {
          pvVar13 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                              (&this->types,(ulong)uVar4);
          local_d49 = HeapType::isStruct(pvVar13);
        }
        if (local_d49 == false) {
          std::operator<<((ostream *)&std::cerr,
                          "warning: invalid field index in name field section\n");
        }
        processor_8.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
        NameProcessor::NameProcessor((NameProcessor *)&i_9);
        sVar16._M_str = (char *)name_7.super_IString.str._M_len;
        sVar16._M_len = (size_t)local_888;
        uStack_860 = 0;
        while( true ) {
          name_7.super_IString.str._M_len = (size_t)sVar16._M_str;
          local_888 = (undefined1  [8])sVar16._M_len;
          if (processor_8.usedNames._M_h._M_single_bucket._4_4_ <= uStack_860) break;
          rawName_7.super_IString.str._M_str._4_4_ = getU32LEB(this);
          NVar17 = getInlineString(this);
          rawName_7.super_IString.str._M_len = NVar17.super_IString.str._M_str;
          name_7.super_IString.str._M_str = NVar17.super_IString.str._M_len;
          sVar16 = (string_view)NameProcessor::process((NameProcessor *)&i_9,NVar17);
          name_7.super_IString.str._M_len = (size_t)sVar16._M_str;
          local_888 = (undefined1  [8])sVar16._M_len;
          if (local_d49 != false) {
            pMVar1 = this->wasm;
            pvVar13 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                (&this->types,(ulong)uVar4);
            pmVar14 = std::
                      unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                      ::operator[](&pMVar1->typeNames,pvVar13);
            pmVar12 = std::
                      unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                      ::operator[](&pmVar14->fieldNames,
                                   (key_type *)((long)&rawName_7.super_IString.str._M_str + 4));
            wasm::Name::operator=(pmVar12,(Name *)local_888);
            sVar16._M_str = (char *)name_7.super_IString.str._M_len;
            sVar16._M_len = (size_t)local_888;
          }
          uStack_860 = uStack_860 + 1;
        }
        NameProcessor::~NameProcessor((NameProcessor *)&i_9);
      }
    }
    else if (local_28 == 0xb) {
      processor_9.usedNames._M_h._M_single_bucket._4_4_ = getU32LEB(this);
      NameProcessor::NameProcessor((NameProcessor *)&i_10);
      for (uStack_8e0 = 0; uStack_8e0 < processor_9.usedNames._M_h._M_single_bucket._4_4_;
          uStack_8e0 = uStack_8e0 + 1) {
        uVar3 = getU32LEB(this);
        sVar16 = (string_view)getInlineString(this);
        name_8.super_IString.str._M_str = (char *)sVar16._M_len;
        local_918 = sVar16;
        NVar17 = NameProcessor::process((NameProcessor *)&i_10,(Name)sVar16);
        name_8.super_IString.str._M_len = NVar17.super_IString.str._M_str;
        sStack_908 = NVar17.super_IString.str._M_len;
        sVar7 = std::
                vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ::size(&this->wasm->tags);
        if (uVar3 < sVar7) {
          this_10 = std::
                    vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ::operator[](&this->wasm->tags,(ulong)uVar3);
          this_11 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_10)
          ;
          local_928 = sStack_908;
          sStack_920 = name_8.super_IString.str._M_len;
          NVar17.super_IString.str._M_str = (char *)name_8.super_IString.str._M_len;
          NVar17.super_IString.str._M_len = sStack_908;
          Named::setExplicitName((Named *)this_11,NVar17);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: tag index out of bounds in name section, tag subsection: "
                                  );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (local_948,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &name_8.super_IString.str._M_str,&local_949);
          poVar5 = std::operator<<(poVar5,local_948);
          poVar5 = std::operator<<(poVar5," at index ");
          std::__cxx11::to_string(&local_970,uVar3);
          poVar5 = std::operator<<(poVar5,(string *)&local_970);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_970);
          std::__cxx11::string::~string(local_948);
          std::allocator<char>::~allocator(&local_949);
        }
      }
      NameProcessor::~NameProcessor((NameProcessor *)&i_10);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"warning: unknown name subsection with id ");
      std::__cxx11::to_string(&local_990,local_28);
      poVar5 = std::operator<<(poVar5,(string *)&local_990);
      poVar5 = std::operator<<(poVar5," at ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,this->pos);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_990);
      this->pos = local_38 + subsectionPos._4_4_;
    }
  } while (this->pos == local_38 + subsectionPos._4_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"bad names subsection position change",&local_9b1);
  throwError(this,&local_9b0);
}

Assistant:

void WasmBinaryBuilder::readNames(size_t payloadLen) {
  BYN_TRACE("== readNames\n");
  auto sectionPos = pos;
  uint32_t lastType = 0;
  while (pos < sectionPos + payloadLen) {
    auto nameType = getU32LEB();
    if (lastType && nameType <= lastType) {
      std::cerr << "warning: out-of-order name subsection: " << nameType
                << std::endl;
    }
    lastType = nameType;
    auto subsectionSize = getU32LEB();
    auto subsectionPos = pos;
    using Subsection = BinaryConsts::CustomSections::Subsection;
    if (nameType == Subsection::NameModule) {
      wasm.name = getInlineString();
    } else if (nameType == Subsection::NameFunction) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.functions.size()) {
          wasm.functions[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: function index out of bounds in name section, "
                       "function subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameLocal) {
      auto numFuncs = getU32LEB();
      for (size_t i = 0; i < numFuncs; i++) {
        auto funcIndex = getU32LEB();
        Function* func = nullptr;
        if (funcIndex < wasm.functions.size()) {
          func = wasm.functions[funcIndex].get();
        } else {
          std::cerr
            << "warning: function index out of bounds in name section, local "
               "subsection: "
            << std::to_string(funcIndex) << std::endl;
        }
        auto numLocals = getU32LEB();
        NameProcessor processor;
        for (size_t j = 0; j < numLocals; j++) {
          auto localIndex = getU32LEB();
          auto rawLocalName = getInlineString();
          if (!func) {
            continue; // read and discard in case of prior error
          }
          auto localName = processor.process(rawLocalName);
          if (localName.size() == 0) {
            std::cerr << "warning: empty local name at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          } else if (localIndex < func->getNumLocals()) {
            func->localNames[localIndex] = localName;
          } else {
            std::cerr << "warning: local index out of bounds in name "
                         "section, local subsection: "
                      << std::string(rawLocalName.str) << " at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          }
        }
      }
    } else if (nameType == Subsection::NameType) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < types.size()) {
          wasm.typeNames[types[index]].name = name;
        } else {
          std::cerr << "warning: type index out of bounds in name section, "
                       "type subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameTable) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.tables.size()) {
          auto* table = wasm.tables[index].get();
          for (auto& segment : wasm.elementSegments) {
            if (segment->table == table->name) {
              segment->table = name;
            }
          }
          table->setExplicitName(name);
        } else {
          std::cerr << "warning: table index out of bounds in name section, "
                       "table subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameElem) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.elementSegments.size()) {
          wasm.elementSegments[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: elem index out of bounds in name section, "
                       "elem subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameMemory) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.memories.size()) {
          wasm.memories[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: memory index out of bounds in name section, "
                       "memory subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameData) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.dataSegments.size()) {
          wasm.dataSegments[i]->setExplicitName(name);
        } else {
          std::cerr << "warning: data index out of bounds in name section, "
                       "data subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameGlobal) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.globals.size()) {
          wasm.globals[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: global index out of bounds in name section, "
                       "global subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameField) {
      auto numTypes = getU32LEB();
      for (size_t i = 0; i < numTypes; i++) {
        auto typeIndex = getU32LEB();
        bool validType =
          typeIndex < types.size() && types[typeIndex].isStruct();
        if (!validType) {
          std::cerr << "warning: invalid field index in name field section\n";
        }
        auto numFields = getU32LEB();
        NameProcessor processor;
        for (size_t i = 0; i < numFields; i++) {
          auto fieldIndex = getU32LEB();
          auto rawName = getInlineString();
          auto name = processor.process(rawName);
          if (validType) {
            wasm.typeNames[types[typeIndex]].fieldNames[fieldIndex] = name;
          }
        }
      }
    } else if (nameType == Subsection::NameTag) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.tags.size()) {
          wasm.tags[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: tag index out of bounds in name section, "
                       "tag subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else {
      std::cerr << "warning: unknown name subsection with id "
                << std::to_string(nameType) << " at " << pos << std::endl;
      pos = subsectionPos + subsectionSize;
    }
    if (pos != subsectionPos + subsectionSize) {
      throwError("bad names subsection position change");
    }
  }
  if (pos != sectionPos + payloadLen) {
    throwError("bad names section position change");
  }
}